

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementShellANCF_3833.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChElementShellANCF_3833::AddLayer
          (ChElementShellANCF_3833 *this,double thickness,double theta,
          shared_ptr<chrono::fea::ChMaterialShellANCF> *material)

{
  long lVar1;
  long lVar2;
  long lVar3;
  __shared_ptr<chrono::fea::ChMaterialShellANCF,_(__gnu_cxx::_Lock_policy)2> local_40;
  Layer local_30;
  
  std::__shared_ptr<chrono::fea::ChMaterialShellANCF,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_40,
             &material->
              super___shared_ptr<chrono::fea::ChMaterialShellANCF,_(__gnu_cxx::_Lock_policy)2>);
  Layer::Layer(&local_30,thickness,theta,(shared_ptr<chrono::fea::ChMaterialShellANCF> *)&local_40);
  std::
  vector<chrono::fea::ChElementShellANCF_3833::Layer,_Eigen::aligned_allocator<chrono::fea::ChElementShellANCF_3833::Layer>_>
  ::emplace_back<chrono::fea::ChElementShellANCF_3833::Layer>(&this->m_layers,&local_30);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_30.m_material.
              super___shared_ptr<chrono::fea::ChMaterialShellANCF,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
  std::vector<double,_Eigen::aligned_allocator<double>_>::push_back
            (&this->m_layer_zoffsets,&this->m_thicknessZ);
  this->m_numLayers = this->m_numLayers + 1;
  this->m_thicknessZ = thickness + this->m_thicknessZ;
  lVar1 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
          m_cols * (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                   m_storage.m_rows;
  lVar2 = (this->m_O1).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
          m_cols * (this->m_O1).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                   m_storage.m_rows;
  lVar3 = lVar2 + lVar1;
  if (lVar3 != 0 && SCARRY8(lVar2,lVar1) == lVar3 < 0) {
    PrecomputeInternalForceMatricesWeights(this);
  }
  return;
}

Assistant:

void ChElementShellANCF_3833::AddLayer(double thickness, double theta, std::shared_ptr<ChMaterialShellANCF> material) {
    m_layers.push_back(Layer(thickness, theta, material));
    m_layer_zoffsets.push_back(m_thicknessZ);
    m_numLayers += 1;
    m_thicknessZ += thickness;

    // Check to see if SetupInitial has already been called (i.e. at least one set of precomputed matrices has been
    // populated).  If so, the precomputed matrices will need to be re-generated.  If not, this will be handled once
    // SetupInitial is called.
    if (m_SD.size() + m_O1.size() > 0) {
        PrecomputeInternalForceMatricesWeights();
    }
}